

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesImpl<true,true,false>
          (BeagleCPU4StateSSEImpl<double,2,0> *this,double *outDerivatives,double *outSumDerivatives
          ,double *outSumSquaredDerivatives)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  int k;
  long lVar9;
  double dVar10;
  double dVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  
  dVar10 = 0.0;
  dVar12 = 0.0;
  for (lVar9 = 0; iVar3 = *(int *)(this + 0x14), lVar9 < (long)iVar3 + -1; lVar9 = lVar9 + 2) {
    auVar11 = vdivpd_avx(*(undefined1 (*) [16])(*(long *)(this + 0x100) + lVar9 * 8),
                         *(undefined1 (*) [16])(*(long *)(this + 0xf8) + lVar9 * 8));
    pdVar1 = (double *)(*(long *)(this + 0x80) + lVar9 * 8);
    dVar7 = *pdVar1;
    dVar8 = pdVar1[1];
    *(undefined1 (*) [16])(outDerivatives + lVar9) = auVar11;
    dVar10 = dVar10 + auVar11._0_8_ * dVar7;
    dVar12 = dVar12 + auVar11._8_8_ * dVar8;
  }
  lVar4 = *(long *)(this + 0x100);
  lVar5 = *(long *)(this + 0x80);
  lVar6 = *(long *)(this + 0xf8);
  auVar11._0_8_ = dVar10 + dVar12;
  auVar11._8_8_ = dVar10 + dVar12;
  for (; lVar9 < iVar3; lVar9 = lVar9 + 1) {
    auVar13._0_8_ = *(double *)(lVar4 + lVar9 * 8) / *(double *)(lVar6 + lVar9 * 8);
    auVar13._8_8_ = 0;
    outDerivatives[lVar9] = auVar13._0_8_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(lVar5 + lVar9 * 8);
    auVar11 = vfmadd231sd_fma(auVar11,auVar13,auVar2);
  }
  *outSumDerivatives = auVar11._0_8_;
  return;
}

Assistant:

void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    V_Real vSum = VEC_SETZERO();
    V_Real vSumSquared = VEC_SETZERO();

    int k = 0;
    for (; k < kPatternCount - 1; k += 2) {

        V_Real numerator = VEC_LOAD(grandNumeratorDerivTmp + k);
        V_Real denominator = VEC_LOAD(grandDenominatorDerivTmp + k);
        V_Real derivative = VEC_DIV(numerator, denominator);
        V_Real patternWeight = VEC_LOAD(gPatternWeights + k);

        if (DoDerivatives) {
            VEC_STOREU(outDerivatives + k, derivative);
        }

        if (DoSum) {
            vSum = VEC_MADD(derivative, patternWeight, vSum);
        }

        if (DoSumSquared) {
            derivative = VEC_MULT(derivative, derivative);
            vSumSquared = VEC_MADD(derivative, patternWeight, vSumSquared);
        }
    }

    double sum;
    double sumSquared;

    if (DoSum) {
        sum = _mm_cvtsd_f64(VEC_ADD(vSum, VEC_SWAP(vSum)));
    }

    if (DoSumSquared) {
        sumSquared = _mm_cvtsd_f64(VEC_ADD(vSumSquared, VEC_SWAP(vSumSquared)));
    }

    for (; k < kPatternCount; ++k) {
        double derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) {
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}